

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int Cba_ObjSigned(Cba_Ntk_t *p,int i)

{
  uint uVar1;
  char *pcVar2;
  
  if (i < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
  }
  if (i < (p->vObjFon0).nSize) {
    uVar1 = (p->vObjFon0).pArray[(uint)i];
    if ((long)(int)uVar1 < 0) {
      pcVar2 = Abc_NamStr(p->pDesign->pFuns,~uVar1);
      pcVar2 = strchr(pcVar2,0x73);
      uVar1 = (uint)(pcVar2 != (char *)0x0);
    }
    else {
      if (uVar1 == 0) {
        __assert_fail("Cba_FonIsReal(f)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                      ,0x112,"int Cba_FonRangeId(Cba_Ntk_t *, int)");
      }
      if ((p->vFonRange).nSize < 1) {
        uVar1 = 0;
      }
      else {
        Vec_IntFillExtra(&p->vFonRange,uVar1 + 1,0);
        if ((p->vFonRange).nSize <= (int)uVar1) goto LAB_003a9aa5;
        uVar1 = (p->vFonRange).pArray[(int)uVar1];
      }
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      uVar1 = uVar1 & 1;
    }
    return uVar1;
  }
LAB_003a9aa5:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int            Cba_ObjSigned( Cba_Ntk_t * p, int i )           { return Cba_FonSigned( p, Cba_ObjFon0(p, i) );                                               }